

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save_attachment_to_file.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  CMimeMessage_T **__ptr;
  long local_48;
  CMimeMessage_T *message;
  char *out_file;
  char *in_file;
  
  out_file = (char *)0x0;
  message = (CMimeMessage_T *)0x0;
  do {
    while( true ) {
      iVar1 = getopt(argc,argv,"hi:o:");
      if (iVar1 != 0x68) break;
LAB_00101273:
      usage();
    }
    if (iVar1 == 0x69) {
      __ptr = (CMimeMessage_T **)&out_file;
    }
    else {
      if (iVar1 != 0x6f) {
        if (iVar1 == -1) {
          if ((out_file == (char *)0x0) || (message == (CMimeMessage_T *)0x0)) {
            puts("you have to specify an input file with -i and an output file with -o");
            iVar1 = -1;
          }
          else {
            local_48 = cmime_message_new();
            iVar1 = 0;
            iVar2 = cmime_message_from_file(&local_48,out_file,0);
            if (iVar2 == 0) {
              cmime_part_to_file(**(undefined8 **)(*(long *)(local_48 + 0x28) + 0x10),message);
            }
            else {
              printf("failed opening file [%s]\n",out_file);
              iVar1 = -1;
            }
            cmime_message_free(local_48);
          }
          free(out_file);
          free(message);
          return iVar1;
        }
        goto LAB_00101273;
      }
      __ptr = &message;
    }
    asprintf((char **)__ptr,"%s",_optarg);
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
    int option;
    int retval = 0;
    char *in_file = NULL;
    char *out_file = NULL;
    //int ret;
    int i=0;

    // check command line parameters
    while((option = getopt(argc,argv,"hi:o:")) != EOF) {
        switch(option) {
            case 'i':
                asprintf(&in_file, "%s", optarg);
                break;
            case 'o':
                asprintf(&out_file, "%s", optarg);
                break;  
            case 'h':
                usage();
                break; 
            default:
                usage();
        }
    }

    if(in_file != NULL && out_file != NULL) {

        CMimeMessage_T *message = cmime_message_new();
        CMimePart_T *mp = NULL;
        CMimeListElem_T *elem = NULL;

        i = cmime_message_from_file(&message,in_file,0);
        if(i == 0) {

            /* normally we would go through all the parts like follows */
            /*
            elem = cmime_list_head(message->parts);
            elem = elem->next;
            while(elem != NULL) {
                mp = (CMimePart_T *)cmime_list_data(elem);
                ret = cmime_part_to_file(mp,out_file);
                printf("RET: [%d]\n",ret);
                elem = elem->next;
                break;
            }
            */

            /* for demonstration purpose we just check for the first
               element in the list */
            elem = cmime_list_head(message->parts);
            mp = (CMimePart_T *)cmime_list_data(elem);
            cmime_part_to_file(mp,out_file);

        } else {
            printf("failed opening file [%s]\n", in_file);
            retval = -1;
        }

         // free the initialized object
         cmime_message_free(message);
    } else {
        printf("you have to specify an input file with -i and an output file with -o\n");
        retval = -1;
    }

    if(in_file != NULL)
        free(in_file);
    if(out_file != NULL)
        free(out_file);


    return retval;


}